

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall CTcMake::check_module_collision(CTcMake *this,CTcMakeModule *new_mod)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CTcMakeModule *pCVar5;
  textchar_t *ptVar6;
  char new_name_buf [8202];
  
  ptVar6 = (new_mod->src_).buf_;
  if (ptVar6 == (textchar_t *)0x0) {
    ptVar6 = "";
  }
  pcVar2 = os_get_root_name(ptVar6);
  pCVar5 = (CTcMakeModule *)&this->mod_head_;
  while( true ) {
    pCVar5 = pCVar5->nxt_;
    if (pCVar5 == (CTcMakeModule *)0x0) {
      return;
    }
    if (pCVar5 == new_mod) break;
    ptVar6 = (pCVar5->src_).buf_;
    if (ptVar6 == (textchar_t *)0x0) {
      ptVar6 = "";
    }
    pcVar3 = os_get_root_name(ptVar6);
    iVar1 = stricmp(pcVar3,pcVar2);
    if (iVar1 == 0) {
      if (new_mod->source_type_ == TCMOD_SOURCE_NORMAL) {
        pcVar2 = (new_mod->src_).buf_;
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "";
        }
        sprintf(new_name_buf,"\"%s\"",pcVar2);
      }
      else {
        pcVar3 = tcerr_get_msg(0x2971,0);
        pcVar2 = (new_mod->src_).buf_;
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "";
        }
        pcVar4 = (new_mod->lib_name_).buf_;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "";
        }
        sprintf(new_name_buf,pcVar3,pcVar2,pcVar4);
      }
      if (pCVar5->source_type_ == TCMOD_SOURCE_NORMAL) {
        iVar1 = 0x296f;
      }
      else {
        iVar1 = 0x2970;
      }
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,iVar1,new_name_buf);
      return;
    }
  }
  return;
}

Assistant:

void CTcMake::check_module_collision(CTcMakeModule *new_mod)
{
    const char *new_root;
    CTcMakeModule *cur_mod;

    /* get the root name of this module */
    new_root = os_get_root_name((char *)new_mod->get_source_name());

    /* 
     *   Scan the list of modules for a collision.  Stop when we get to this
     *   module, because we want to report the collision at the later module,
     *   so that we report basically in the order of adding modules to the
     *   build.  
     */
    for (cur_mod = mod_head_ ; cur_mod != 0 && cur_mod != new_mod ;
         cur_mod = cur_mod->get_next())
    {
        const char *cur_root;

        /* 
         *   Compare this module's root name.  Since some file systems are
         *   insensitive to case, ignore case ourselves; this is more
         *   restrictive than is actually necessary on some systems, but will
         *   flag the potential for problems in case the project is later
         *   moved to a different operating system.  
         */
        cur_root = os_get_root_name((char *)cur_mod->get_source_name());
        if (stricmp(cur_root, new_root) == 0)
        {
            char new_name_buf[OSFNMAX*2 + 10];

            /* if the new module is from a library, so note */
            if (new_mod->get_source_type() == TCMOD_SOURCE_NORMAL)
            {
                /* it's not from a library - just show the module name */
                sprintf(new_name_buf, "\"%s\"", new_mod->get_source_name());
            }
            else
            {
                /* it is from a library - show the library name as well */
                sprintf(new_name_buf,
                        tcerr_get_msg(TCERR_SOURCE_FROM_LIB, FALSE),
                        new_mod->get_source_name(), new_mod->get_from_lib());
            }

            /*
             *   Flag a warning.  If the older module is from a library, use
             *   a separate version of the message, so that we can mention
             *   the library it's from.  
             */
            if (cur_mod->get_source_type() == TCMOD_SOURCE_NORMAL)
            {
                /* the older module isn't from a library */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MODULE_NAME_COLLISION,
                                    new_name_buf);
            }
            else
            {
                /* the older module is in a library, so mention the source */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MODULE_NAME_COLLISION_WITH_LIB,
                                    new_name_buf, cur_mod->get_from_lib());
            }

            /* 
             *   there's no need to find yet another module with the same
             *   name - it's good enough to flag the error once 
             */
            break;
        }
    }
}